

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

BinaryExpr<const_Jinx::Variant_&,_const_double_&> * __thiscall
Catch::ExprLhs<Jinx::Variant_const&>::operator==
          (BinaryExpr<const_Jinx::Variant_&,_const_double_&> *__return_storage_ptr__,
          ExprLhs<Jinx::Variant_const&> *this,double *rhs)

{
  Variant *pVVar1;
  bool bVar2;
  StringRef local_38;
  
  bVar2 = compareEqual<Jinx::Variant,double>(*(Variant **)this,rhs);
  pVVar1 = *(Variant **)this;
  StringRef::StringRef(&local_38,"==");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = bVar2;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_0024c168;
  __return_storage_ptr__->m_lhs = pVVar1;
  (__return_storage_ptr__->m_op).m_start = local_38.m_start;
  (__return_storage_ptr__->m_op).m_size = local_38.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }